

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O2

size_t lj_gc_separateudata(global_State *g,int all)

{
  uint uVar1;
  uint uVar2;
  cTValue *pcVar3;
  byte bVar4;
  GCobj *root;
  uint *puVar5;
  GCtab *mt;
  uint *puVar6;
  uint *puVar7;
  size_t sVar8;
  
  sVar8 = 0;
  puVar7 = (uint *)(ulong)(g->mainthref).gcptr32;
  do {
    while( true ) {
      do {
        puVar6 = puVar7;
        uVar1 = *puVar6;
        puVar7 = (uint *)(ulong)uVar1;
        if (puVar7 == (uint *)0x0) {
          return sVar8;
        }
        bVar4 = (byte)puVar7[1];
      } while (((bVar4 & 8) != 0) || ((bVar4 & 3) == 0 && all == 0));
      mt = (GCtab *)(ulong)puVar7[4];
      if ((mt != (GCtab *)0x0) && ((mt->nomm & 4) == 0)) break;
LAB_0010eae9:
      *(byte *)(puVar7 + 1) = bVar4 | 8;
    }
    pcVar3 = lj_meta_cache(mt,MM_gc,(GCstr *)(ulong)g->gcroot[2].gcptr32);
    bVar4 = (byte)puVar7[1];
    if (pcVar3 == (cTValue *)0x0) goto LAB_0010eae9;
    uVar2 = puVar7[3];
    *(byte *)(puVar7 + 1) = bVar4 | 8;
    *puVar6 = *puVar7;
    puVar5 = (uint *)(ulong)(g->gc).mmudata.gcptr32;
    if (puVar5 == (uint *)0x0) {
      *puVar7 = uVar1;
    }
    else {
      *puVar7 = *puVar5;
      *puVar5 = uVar1;
    }
    sVar8 = sVar8 + uVar2 + 0x18;
    (g->gc).mmudata.gcptr32 = uVar1;
    puVar7 = puVar6;
  } while( true );
}

Assistant:

size_t lj_gc_separateudata(global_State *g, int all)
{
  size_t m = 0;
  GCRef *p = &mainthread(g)->nextgc;
  GCobj *o;
  while ((o = gcref(*p)) != NULL) {
    if (!(iswhite(o) || all) || isfinalized(gco2ud(o))) {
      p = &o->gch.nextgc;  /* Nothing to do. */
    } else if (!lj_meta_fastg(g, tabref(gco2ud(o)->metatable), MM_gc)) {
      markfinalized(o);  /* Done, as there's no __gc metamethod. */
      p = &o->gch.nextgc;
    } else {  /* Otherwise move userdata to be finalized to mmudata list. */
      m += sizeudata(gco2ud(o));
      markfinalized(o);
      *p = o->gch.nextgc;
      if (gcref(g->gc.mmudata)) {  /* Link to end of mmudata list. */
	GCobj *root = gcref(g->gc.mmudata);
	setgcrefr(o->gch.nextgc, root->gch.nextgc);
	setgcref(root->gch.nextgc, o);
	setgcref(g->gc.mmudata, o);
      } else {  /* Create circular list. */
	setgcref(o->gch.nextgc, o);
	setgcref(g->gc.mmudata, o);
      }
    }
  }
  return m;
}